

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O3

void __thiscall
anurbs::PointOnCurveProjection<2L>::compute
          (PointOnCurveProjection<2L> *this,Vector *sample,double max_distance)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pdVar3;
  pointer pMVar4;
  double *pdVar5;
  pointer pMVar6;
  _Tuple_impl<3UL,_long> _Var7;
  _Head_base<2UL,_double,_false> _Var8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double *pdVar13;
  double dVar14;
  double dVar15;
  pointer pMVar16;
  double dVar17;
  double in_XMM1_Qa;
  double dVar18;
  undefined8 in_XMM1_Qb;
  double dVar19;
  double dVar20;
  double *in_XMM8_Qa;
  pointer in_XMM8_Qb;
  double *pdVar21;
  pointer pMVar22;
  double dVar23;
  double *in_XMM12_Qa;
  double dVar24;
  pointer in_XMM12_Qb;
  double dVar25;
  Vector point_at_t1;
  Vector point_at_t0;
  double *local_c8;
  pointer pMStack_c0;
  tuple<double,_long,_double,_long> local_b8;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  pointer local_78;
  pointer pMStack_70;
  _Head_base<3UL,_long,_false> local_68;
  pointer pMStack_60;
  double local_58;
  undefined8 uStack_50;
  Vector local_48;
  
  peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_CurveBase[3])();
  local_98 = in_XMM1_Qa;
  uStack_90 = in_XMM1_Qb;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  dVar12 = 0.0;
  if (max_distance <= 0.0) {
    pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    local_68._M_head_impl = (long)in_XMM12_Qa;
    pMStack_60 = in_XMM12_Qb;
    if (1 < lVar9) {
      pMVar4 = (this->m_tessellation).second.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar15 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
               m_data.array[0];
      dVar14 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
               m_data.array[1];
      lVar10 = 1;
      dVar12 = 0.0;
      dVar17 = INFINITY;
      pdVar21 = *(double **)
                 &(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                  m_data;
      pMVar22 = (pointer)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                         m_storage.m_data.array[1];
      dVar20 = *pdVar3;
      do {
        dVar19 = pdVar3[lVar10];
        pdVar5 = *(double **)
                  &pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                   m_data;
        pMVar6 = (pointer)pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                          m_storage.m_data.array[1];
        dVar24 = (double)pdVar5 - (double)pdVar21;
        dVar25 = (double)pMVar6 - (double)pMVar22;
        dVar18 = dVar25 * dVar25 + dVar24 * dVar24;
        dVar23 = dVar20;
        pdVar13 = pdVar21;
        pMVar16 = pMVar22;
        if (((1e-14 <= dVar18) &&
            (dVar18 = 1.0 / dVar18,
            dVar18 = (dVar14 - (double)pMVar22) * dVar18 * dVar25 +
                     (dVar15 - (double)pdVar21) * dVar18 * dVar24, 0.0 <= dVar18)) &&
           (dVar23 = dVar19, pdVar13 = pdVar5, pMVar16 = pMVar6, dVar18 <= 1.0)) {
          dVar23 = (dVar19 - dVar20) * dVar18 + dVar20;
          pdVar13 = (double *)((double)pdVar21 + dVar24 * dVar18);
          pMVar16 = (pointer)((double)pMVar22 + dVar25 * dVar18);
        }
        dVar20 = (double)pdVar13 - dVar15;
        dVar18 = (double)pMVar16 - dVar14;
        dVar18 = dVar18 * dVar18 + dVar20 * dVar20;
        dVar20 = dVar18;
        if (dVar17 <= dVar18) {
          dVar20 = dVar17;
          pMVar16 = in_XMM8_Qb;
          pdVar13 = in_XMM8_Qa;
        }
        in_XMM8_Qa = pdVar13;
        in_XMM8_Qb = pMVar16;
        dVar12 = (double)(~-(ulong)(dVar18 < dVar17) & (ulong)dVar12 |
                         (ulong)dVar23 & -(ulong)(dVar18 < dVar17));
        lVar10 = lVar10 + 1;
        dVar17 = dVar20;
        pdVar21 = pdVar5;
        pMVar22 = pMVar6;
        dVar20 = dVar19;
        local_68._M_head_impl = (long)in_XMM8_Qa;
        pMStack_60 = in_XMM8_Qb;
        pMVar4 = pMVar4 + 1;
      } while (lVar9 != lVar10);
    }
  }
  else {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1];
    PolylineMapper<2L>::map
              (&local_b8,
               (this->mapper)._M_t.
               super___uniq_ptr_impl<anurbs::PolylineMapper<2L>,_std::default_delete<anurbs::PolylineMapper<2L>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_anurbs::PolylineMapper<2L>_*,_std::default_delete<anurbs::PolylineMapper<2L>_>_>
               .super__Head_base<0UL,_anurbs::PolylineMapper<2L>_*,_false>._M_head_impl,&local_48,
               max_distance);
    pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar12 = pdVar3[local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                    super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>.
                    _M_head_impl] *
             local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl +
             pdVar3[(long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                          super__Tuple_impl<1UL,_long,_double,_long>.
                          super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                          super__Head_base<3UL,_long,_false>._M_head_impl] *
             local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
             super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
             super__Head_base<2UL,_double,_false>._M_head_impl;
    pMVar4 = (this->m_tessellation).second.
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMStack_c0 = pMVar4 + local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                          super__Tuple_impl<1UL,_long,_double,_long>.
                          super__Head_base<1UL,_long,_false>._M_head_impl;
    pMStack_70 = pMVar4 + (long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                                super__Tuple_impl<1UL,_long,_double,_long>.
                                super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                                super__Head_base<3UL,_long,_false>._M_head_impl;
    local_c8 = (double *)
               local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
    local_78 = (pointer)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                        super__Tuple_impl<1UL,_long,_double,_long>.
                        super__Tuple_impl<2UL,_double,_long>.super__Head_base<2UL,_double,_false>.
                        _M_head_impl;
    local_68._M_head_impl =
         (long)(local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
                super__Head_base<2UL,_double,_false>._M_head_impl *
                pMVar4[(long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                             super__Tuple_impl<1UL,_long,_double,_long>.
                             super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                             super__Head_base<3UL,_long,_false>._M_head_impl].
                super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
                [0] + local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                      super__Head_base<0UL,_double,_false>._M_head_impl *
                      pMVar4[local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                             super__Tuple_impl<1UL,_long,_double,_long>.
                             super__Head_base<1UL,_long,_false>._M_head_impl].
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                      array[0]);
    pMStack_60 = (pointer)(local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                           super__Tuple_impl<1UL,_long,_double,_long>.
                           super__Tuple_impl<2UL,_double,_long>.super__Head_base<2UL,_double,_false>
                           ._M_head_impl *
                           pMVar4[(long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                                        super__Tuple_impl<1UL,_long,_double,_long>.
                                        super__Tuple_impl<2UL,_double,_long>.
                                        super__Tuple_impl<3UL,_long>.
                                        super__Head_base<3UL,_long,_false>._M_head_impl].
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                           m_data.array[1] +
                          local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                          super__Head_base<0UL,_double,_false>._M_head_impl *
                          pMVar4[local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                                 super__Tuple_impl<1UL,_long,_double,_long>.
                                 super__Head_base<1UL,_long,_false>._M_head_impl].
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                          m_data.array[1]);
  }
  dVar15 = this->m_tolerance;
  local_58 = local_98;
  if (extraout_XMM0_Qa <= local_98) {
    local_58 = extraout_XMM0_Qa;
  }
  uStack_50 = uStack_90;
  local_80 = local_98;
  if (local_98 <= extraout_XMM0_Qa) {
    local_80 = extraout_XMM0_Qa;
  }
  lVar9 = 5;
  do {
    peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_CurveBase[6])(&local_b8,peVar1,2);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    dVar14 = *(double *)
              local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
              super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
              super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl -
             (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[0];
    dVar17 = *(double *)
              ((long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl +
              8) - (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                   m_data.array[1];
    dVar20 = SQRT(dVar17 * dVar17 + dVar14 * dVar14);
    if (dVar20 < dVar15) {
LAB_001b98d8:
      operator_delete((void *)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                              super__Tuple_impl<1UL,_long,_double,_long>.
                              super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                              super__Head_base<3UL,_long,_false>._M_head_impl,
                      local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                      super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>.
                      _M_head_impl -
                      (long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                            super__Tuple_impl<1UL,_long,_double,_long>.
                            super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                            super__Head_base<3UL,_long,_false>._M_head_impl);
      break;
    }
    dVar19 = *(double *)
              ((long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl +
              0x10);
    dVar23 = *(double *)
              ((long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl +
              0x18);
    dVar18 = dVar23 * dVar17 + dVar19 * dVar14;
    dVar19 = dVar23 * dVar23 + dVar19 * dVar19;
    dVar20 = SQRT(dVar19) * dVar20;
    if ((double)(-(ulong)(dVar20 != 0.0) & (ulong)ABS(dVar18 / dVar20)) < dVar15 * 5.0)
    goto LAB_001b98d8;
    dVar12 = dVar12 - dVar18 / (dVar19 + dVar17 * *(double *)
                                                   ((long)local_b8.
                                                  super__Tuple_impl<0UL,_double,_long,_double,_long>
                                                  .super__Tuple_impl<1UL,_long,_double,_long>.
                                                  super__Tuple_impl<2UL,_double,_long>.
                                                  super__Tuple_impl<3UL,_long>.
                                                  super__Head_base<3UL,_long,_false>._M_head_impl +
                                                  0x28) +
                                         dVar14 * *(double *)
                                                   ((long)local_b8.
                                                  super__Tuple_impl<0UL,_double,_long,_double,_long>
                                                  .super__Tuple_impl<1UL,_long,_double,_long>.
                                                  super__Tuple_impl<2UL,_double,_long>.
                                                  super__Tuple_impl<3UL,_long>.
                                                  super__Head_base<3UL,_long,_false>._M_head_impl +
                                                  0x20));
    dVar14 = local_80;
    if (dVar12 <= local_80) {
      dVar14 = dVar12;
    }
    dVar12 = (double)(-(ulong)(dVar12 < local_58) & (ulong)local_58 |
                     ~-(ulong)(dVar12 < local_58) & (ulong)dVar14);
    operator_delete((void *)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                            super__Tuple_impl<1UL,_long,_double,_long>.
                            super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                            super__Head_base<3UL,_long,_false>._M_head_impl,
                    local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                    super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>.
                    _M_head_impl -
                    (long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                          super__Tuple_impl<1UL,_long,_double,_long>.
                          super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                          super__Head_base<3UL,_long,_false>._M_head_impl);
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_CurveBase[5])(&local_b8);
  _Var8._M_head_impl =
       local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
       super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
       super__Head_base<2UL,_double,_false>._M_head_impl;
  _Var7.super__Head_base<3UL,_long,_false>._M_head_impl =
       local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
       super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
       super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
       (_Head_base<3UL,_long,_false>)(_Head_base<3UL,_long,_false>)local_68._M_head_impl;
  local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Head_base<2UL,_double,_false>._M_head_impl = (double)pMStack_60;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  dVar15 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0];
  dVar14 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1];
  peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_CurveBase[5])(extraout_XMM0_Qa,&local_b8);
  dVar15 = dVar15 - (double)_Var7.super__Head_base<3UL,_long,_false>._M_head_impl;
  dVar14 = dVar14 - _Var8._M_head_impl;
  dVar15 = dVar14 * dVar14 + dVar15 * dVar15;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  dVar14 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0] -
           (double)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                   super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
                   super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1] -
           local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
           super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
           super__Head_base<2UL,_double,_false>._M_head_impl;
  if (dVar15 <= dVar17 * dVar17 + dVar14 * dVar14) {
    peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_CurveBase[5])(local_98,&local_c8);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    dVar14 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[0] - (double)local_c8;
    dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[1] - (double)pMStack_c0;
    dVar14 = dVar17 * dVar17 + dVar14 * dVar14;
    uVar11 = -(ulong)(dVar14 < dVar15);
    local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
    super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
    super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(_Head_base<3UL,_long,_false>)local_c8;
    local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
    super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
    super__Head_base<2UL,_double,_false>._M_head_impl = (double)pMStack_c0;
    if (dVar15 <= dVar14) {
      local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
      super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
      super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
           _Var7.super__Head_base<3UL,_long,_false>._M_head_impl;
      local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
      super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
      super__Head_base<2UL,_double,_false>._M_head_impl = _Var8._M_head_impl;
    }
    this->m_parameter = (double)(~uVar11 & (ulong)dVar12 | uVar11 & (ulong)local_98);
  }
  else {
    this->m_parameter = extraout_XMM0_Qa;
  }
  (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[0] = (double)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[1] = local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
             super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
             super__Head_base<2UL,_double,_false>._M_head_impl;
  return;
}

Assistant:

void compute(const Vector& sample, const double max_distance = 0)
    {
        const auto domain = Curve()->domain();

        // closest point to polyline

        double closest_parameter = 0;
        Vector closest_point;

        double closest_sq_distance = Infinity;

        const auto& [ts, points] = m_tessellation;

        if (max_distance <= 0) {
            for (Index i = 1; i < length(ts); i++) {
                const auto t0 = ts[i - 1];
                const auto point0 = points[i - 1];
                const auto t1 = ts[i];
                const auto point1 = points[i];

                const auto [t, point] = project_to_line(sample, point0, point1, t0, t1);

                const Vector v = point - sample;

                const double sq_distance = squared_norm(v);

                if (sq_distance < closest_sq_distance) {
                    closest_sq_distance = sq_distance;
                    closest_parameter = t;
                    closest_point = point;
                }
            }
        } else {
            const auto [wa, idx_a, wb, idx_b] = mapper->map(sample, max_distance);

            closest_parameter = wa * ts[idx_a] + wb * ts[idx_b];
            closest_point = wa * points[idx_a] + wb * points[idx_b];
        }

        // newton-raphson

        const Index max_iter = 5;
        const double eps1 = tolerance();
        const double eps2 = tolerance() * 5;

        for (Index i = 0; i < max_iter; i++) {
            auto f = Curve()->derivatives_at(closest_parameter, 2);

            Vector dif = f[0] - sample;

            double c1v = norm(dif);

            double c2n = dot(f[1], dif);
            double c2d = norm(f[1]) * c1v;
            double c2v = c2d != 0 ? c2n / c2d : 0;

            bool c1 = c1v < eps1;
            bool c2 = std::abs(c2v) < eps2;

            if (c1 || c2) { // FIXME: check if 'or' is correct (NURBS Book P.231)
                break;
            }

            double delta = dot(f[1], dif) / (dot(f[2], dif) + squared_norm(f[1]));

            double nextParameter = closest_parameter - delta;

            // FIXME: out-of-domain check

            // FIXME: 3. condition: (nextParameter - closest_parameter) * f[1].norm();

            closest_parameter = domain.clamp(nextParameter);
        }

        closest_point = Curve()->point_at(closest_parameter);

        closest_sq_distance = squared_norm(Vector(sample - closest_point));

        Vector point_at_t0 = Curve()->point_at(domain.t0());

        if (squared_norm(Vector(sample - point_at_t0)) < closest_sq_distance) {
            m_parameter = domain.t0();
            m_point = point_at_t0;
            return;
        }

        Vector point_at_t1 = Curve()->point_at(domain.t1());

        if (squared_norm(Vector(sample - point_at_t1)) < closest_sq_distance) {
            m_parameter = domain.t1();
            m_point = point_at_t1;
            return;
        }

        m_parameter = closest_parameter;
        m_point = closest_point;
    }